

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O0

HelicsTime helicsFederateRequestTime(HelicsFederate fed,HelicsTime requestTime,HelicsError *err)

{
  bool bVar1;
  Federate *in_stack_00000020;
  Time in_stack_00000028;
  Time timeret;
  Federate *fedObj;
  double in_stack_ffffffffffffff98;
  HelicsError *in_stack_ffffffffffffffa8;
  TimeRepresentation<count_time<9,_long>_> in_stack_ffffffffffffffb0;
  TimeRepresentation<count_time<9,_long>_> local_30;
  Federate *local_28;
  double local_8;
  
  local_28 = getFed((HelicsFederate)in_stack_ffffffffffffffb0.internalTimeCode,
                    in_stack_ffffffffffffffa8);
  if (local_28 == (Federate *)0x0) {
    local_8 = -1.785e+39;
  }
  else {
    TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
              ((TimeRepresentation<count_time<9,_long>_> *)local_28,in_stack_ffffffffffffff98);
    local_30.internalTimeCode =
         (baseType)helics::Federate::requestTime(in_stack_00000020,in_stack_00000028);
    TimeRepresentation<count_time<9,_long>_>::maxVal();
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                      (&local_30,
                       (TimeRepresentation<count_time<9,_long>_> *)&stack0xffffffffffffffb0);
    if (bVar1) {
      local_8 = TimeRepresentation::operator_cast_to_double
                          ((TimeRepresentation<count_time<9,_long>_> *)0x1bc2e6);
    }
    else {
      local_8 = 9223372036.854774;
    }
  }
  return local_8;
}

Assistant:

HelicsTime helicsFederateRequestTime(HelicsFederate fed, HelicsTime requestTime, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return HELICS_TIME_INVALID;
    }
    try {
        auto timeret = fedObj->requestTime(requestTime);
        return (timeret < helics::Time::maxVal()) ? static_cast<double>(timeret) : HELICS_TIME_MAXTIME;
    }
    catch (...) {
        helicsErrorHandler(err);
        return HELICS_TIME_INVALID;
    }
}